

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O2

void __thiscall
CheckedRecursiveMutexTest_NonOwnerUnlock_Test<yamc::checked::recursive_timed_mutex>::
CheckedRecursiveMutexTest_NonOwnerUnlock_Test
          (CheckedRecursiveMutexTest_NonOwnerUnlock_Test<yamc::checked::recursive_timed_mutex> *this
          )

{
  CheckedRecursiveMutexTest<yamc::checked::recursive_timed_mutex>::CheckedRecursiveMutexTest
            (&this->super_CheckedRecursiveMutexTest<yamc::checked::recursive_timed_mutex>);
  (this->super_CheckedRecursiveMutexTest<yamc::checked::recursive_timed_mutex>).super_Test.
  _vptr_Test = (_func_int **)&PTR__Test_001e2650;
  return;
}

Assistant:

TYPED_TEST(CheckedRecursiveMutexTest, NonOwnerUnlock) {
  auto test_body = []{
    yamc::test::barrier step(2);
    TypeParam mtx;
    // owner-thread
    yamc::test::join_thread thd([&]{
      ASSERT_NO_THROW(mtx.lock());
      step.await();  // b1
      step.await();  // b2
      ASSERT_NO_THROW(mtx.unlock());
    });
    // other-thread
    {
      step.await();  // b1
      EXPECT_CHECK_FAILURE_INNER(mtx.unlock());
      step.await();  // b2
    }
  };
  EXPECT_CHECK_FAILURE_OUTER(test_body());
}